

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

TestCase *
deqp::gles31::Functional::anon_unknown_0::createDiffTest
          (Context *context,PrePost prepost,char *name,BlendState *commonState,
          BlendState *drawBufferState)

{
  bool *pbVar1;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar2;
  BlendFunc *pBVar3;
  undefined8 uVar4;
  DrawBuffersIndexedTest *this;
  undefined1 uVar5;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *this_00;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers_1;
  BlendState preState;
  BlendState emptyState;
  allocator<char> local_1f9;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  local_1f8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  local_1d8;
  Context *local_1b8;
  undefined1 local_1b0 [32];
  undefined1 local_190 [16];
  string local_180;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_148;
  Maybe<tcu::Vector<bool,_4>_> local_110;
  BlendState local_100;
  BlendState local_98;
  
  local_1b0._0_8_ = (string *)0x0;
  local_100.enableBlend.m_ptr = (bool *)0x0;
  local_190._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1f8.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8 = context;
  BlendState::BlendState
            (&local_98,(Maybe<bool> *)local_1b0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&local_100,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_190,(Maybe<tcu::Vector<bool,_4>_> *)&local_1f8);
  if (prepost == PRE) {
    pbVar1 = (commonState->enableBlend).m_ptr;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&local_1f8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                          ._M_impl + 8);
    if (pbVar1 == (bool *)0x0) {
      uVar5 = 1;
    }
    else {
      uVar5 = *pbVar1;
    }
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_1f8.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,uVar5);
    pEVar2 = (commonState->blendFunc).m_ptr;
    if (pEVar2 == (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      local_1b0._8_8_ =
           (long)&((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                    *)local_1b0)->field_1 + 8;
      local_1b0[0] = 1;
      local_1b0._16_8_ = 0x100000001;
      local_190[8] = '\x01';
      local_180._M_string_length._0_4_ = 1;
      local_180._M_string_length._4_4_ = 1;
    }
    else {
      local_190[8] = pEVar2->m_isFirst;
      pBVar3 = (pEVar2->field_1).m_first;
      if ((bool)local_190[8] == true) {
        local_180._M_string_length = *(size_type *)pBVar3;
      }
      else {
        local_180._M_string_length = *(size_type *)pBVar3;
        local_180.field_2._M_allocated_capacity = (size_type)pBVar3[1];
      }
    }
    local_180._M_dataplus._M_p = (pointer)&local_180._M_string_length;
    local_190._0_8_ = local_190 + 8;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    BlendState::BlendState
              (&local_100,(Maybe<bool> *)&local_1f8,&commonState->blendEq,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_190,(Maybe<tcu::Vector<bool,_4>_> *)&local_1d8);
    uVar4 = local_190._0_8_;
    if ((string *)local_190._0_8_ != (string *)0x0) {
      *(undefined1 *)&((_Alloc_hider *)local_190._0_8_)->_M_p = 1;
      *(size_type *)(uVar4 + 8) = 0;
    }
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000040;
    local_110.m_ptr = (Vector<bool,_4> *)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_190,true,(IVec2 *)&local_1f8,&local_98,
               (TextureFormat *)&local_110);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&local_1d8,(DrawBufferInfo *)local_190);
    if (local_148 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_148->m_isFirst = true;
      (local_148->field_1).m_first = (BlendFunc *)0x0;
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_180.field_2._8_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      *(undefined1 *)local_180.field_2._8_8_ = 1;
      ((anon_union_8_2_067f4667_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_3
        *)(local_180.field_2._8_8_ + 8))->m_first = (uint *)0x0;
    }
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000040;
    local_110.m_ptr = (Vector<bool,_4> *)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_190,true,(IVec2 *)&local_1f8,drawBufferState,
               (TextureFormat *)&local_110);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&local_1d8,(DrawBufferInfo *)local_190);
    if (local_148 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_148->m_isFirst = true;
      (local_148->field_1).m_first = (BlendFunc *)0x0;
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_180.field_2._8_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      *(undefined1 *)local_180.field_2._8_8_ = 1;
      ((anon_union_8_2_067f4667_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_3
        *)(local_180.field_2._8_8_ + 8))->m_first = (uint *)0x0;
    }
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_190,name,(allocator<char> *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,name,&local_1f9);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,local_1b8,&local_100,&local_98,&local_1d8,(string *)local_190._0_8_,
               (string *)
               local_1f8.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (local_1f8.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)((long)&local_1f8.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                         ._M_impl + 0x10U)) {
      operator_delete(local_1f8.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&(local_1f8.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1);
    }
    if ((string *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_,(ulong)((long)local_180._M_dataplus._M_p + 1));
    }
    this_00 = &local_1d8;
  }
  else {
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_1d8.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_1d8.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
    local_1b0._0_8_ =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)&local_1f8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                          ._M_impl + 0x10);
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_1f8.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000001;
    local_190._0_8_ = local_190 + 8;
    local_190[8] = '\x01';
    local_180._M_dataplus._M_p = (pointer)&local_180._M_string_length;
    local_180._M_string_length._0_4_ = 1;
    local_180._M_string_length._4_4_ = 1;
    local_110.m_ptr = (Vector<bool,_4> *)0x0;
    BlendState::BlendState
              (&local_100,(Maybe<bool> *)&local_1d8,
               (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                *)local_1b0,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_190,&local_110);
    uVar4 = local_190._0_8_;
    if ((string *)local_190._0_8_ != (string *)0x0) {
      *(undefined1 *)&((_Alloc_hider *)local_190._0_8_)->_M_p = 1;
      *(size_type *)(uVar4 + 8) = 0;
    }
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0._0_8_ =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         0x4000000040;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_190,true,(IVec2 *)local_1b0,&local_98,
               (TextureFormat *)&local_1d8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&local_1f8,(DrawBufferInfo *)local_190);
    if (local_148 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_148->m_isFirst = true;
      (local_148->field_1).m_first = (BlendFunc *)0x0;
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_180.field_2._8_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      *(undefined1 *)local_180.field_2._8_8_ = 1;
      ((anon_union_8_2_067f4667_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_3
        *)(local_180.field_2._8_8_ + 8))->m_first = (uint *)0x0;
    }
    local_1b0._0_8_ = (string *)0x4000000040;
    local_1d8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_190,true,(IVec2 *)local_1b0,drawBufferState,
               (TextureFormat *)&local_1d8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&local_1f8,(DrawBufferInfo *)local_190);
    if (local_148 !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      local_148->m_isFirst = true;
      (local_148->field_1).m_first = (BlendFunc *)0x0;
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_180.field_2._8_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0) {
      *(undefined1 *)local_180.field_2._8_8_ = 1;
      ((anon_union_8_2_067f4667_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_3
        *)(local_180.field_2._8_8_ + 8))->m_first = (uint *)0x0;
    }
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_190,name,(allocator<char> *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,name,(allocator<char> *)&local_110);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,local_1b8,&local_100,commonState,&local_1f8,(string *)local_190._0_8_,
               (string *)local_1b0._0_8_);
    if ((string *)local_1b0._0_8_ !=
        (string *)
        ((long)&((Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                  *)local_1b0)->field_1 + 8U)) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((string *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_,(ulong)((long)local_180._M_dataplus._M_p + 1));
    }
    this_00 = &local_1f8;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector(this_00);
  if (local_100.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_100.blendFunc.m_ptr)->m_isFirst = true;
    ((local_100.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_100.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_100.blendEq.m_ptr)->m_isFirst = true;
    ((local_100.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  if (local_98.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_98.blendFunc.m_ptr)->m_isFirst = true;
    ((local_98.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_98.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_98.blendEq.m_ptr)->m_isFirst = true;
    ((local_98.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  return &this->super_TestCase;
}

Assistant:

TestCase* createDiffTest (Context& context, PrePost prepost, const char* name, const BlendState& commonState, const BlendState& drawBufferState)
{
	const BlendState emptyState = BlendState(tcu::nothing<bool>(), tcu::nothing<Either<BlendEq, SeparateBlendEq> >(), tcu::nothing<Either<BlendFunc, SeparateBlendFunc> >(), tcu::nothing<BVec4>());

	if (prepost == PRE)
	{
		const BlendState		preState	= BlendState((commonState.enableBlend ? commonState.enableBlend : just(true)),
														 commonState.blendEq,
														 (commonState.blendFunc ? commonState.blendFunc : just(Either<BlendFunc, SeparateBlendFunc>(BlendFunc(GL_ONE, GL_ONE)))),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, emptyState, drawBuffers, name, name);
	}
	else if (prepost == POST)
	{
		const BlendState		preState	= BlendState(just(true),
														 tcu::nothing<Either<BlendEq, SeparateBlendEq> >(),
														 Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_ONE, GL_ONE)),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, commonState, drawBuffers, name, name);
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}